

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ManComputeForwardDirconCut(Of_Man_t *p,int iObj,int *pCut,int *pDelay1,int *pDelay2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pObj;
  bool bVar6;
  int local_9c;
  int fDirConWorks;
  int DelayAfter;
  int Delay;
  int SlowCon;
  int Flag;
  int iVar;
  int k;
  int nSize;
  int DelayLut2;
  int DelayLut1;
  int Perm [6];
  int local_48 [2];
  int Delays [6];
  int *pDelay2_local;
  int *pDelay1_local;
  int *pCut_local;
  int iObj_local;
  Of_Man_t *p_local;
  
  _DelayLut2 = 0x100000000;
  Perm[0] = 2;
  Perm[1] = 3;
  Perm[2] = 4;
  Perm[3] = 5;
  iVar1 = p->pPars->nDelayLut1;
  iVar2 = p->pPars->nDelayLut2;
  Delays._16_8_ = pDelay2;
  iVar3 = Of_CutSize(pCut);
  Flag = 0;
  while( true ) {
    iVar4 = Of_CutSize(pCut);
    bVar6 = false;
    if (Flag < iVar4) {
      SlowCon = Of_CutVar(pCut,Flag);
      bVar6 = SlowCon != 0;
    }
    if (!bVar6) break;
    iVar4 = Of_ObjDelay1(p,SlowCon);
    local_48[Flag] = iVar4 + iVar1;
    Flag = Flag + 1;
  }
  for (; Flag < p->pPars->nLutSize; Flag = Flag + 1) {
    local_48[Flag] = -1000000000;
  }
  Vec_IntSelectSortCost2Reverse(&DelayLut2,iVar3,local_48);
  if ((1 < iVar3) && (local_48[0] < local_48[iVar3 + -1])) {
    __assert_fail("nSize < 2 || Delays[0] >= Delays[nSize-1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                  ,0x52b,"void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)")
    ;
  }
  if ((local_48[0] < 0) || (local_48[iVar3 + -1] < 0)) {
    __assert_fail("Delays[0] >= 0 && Delays[nSize-1] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                  ,0x52c,"void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)")
    ;
  }
  bVar6 = true;
  *(undefined4 *)Delays._16_8_ = 0;
  *pDelay1 = 0;
  if (p->pPars->nFastEdges < iVar3) {
    local_9c = local_48[p->pPars->nFastEdges];
  }
  else {
    local_9c = 0;
  }
  Flag = 0;
  do {
    if (iVar3 <= Flag) {
      if (*(int *)Delays._16_8_ < *pDelay1) {
        for (Flag = 0; Flag < iVar3; Flag = Flag + 1) {
          Of_CutSetFlag(pCut,Flag,0);
        }
        *pDelay1 = *(int *)Delays._16_8_;
      }
      if (*(int *)Delays._16_8_ < *pDelay1) {
        __assert_fail("*pDelay1 <= *pDelay2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                      ,0x553,
                      "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)");
      }
      Of_CutSetDelay1(pCut,*pDelay1);
      Of_CutSetDelay2(pCut,*(int *)Delays._16_8_);
      Flag = 0;
      while( true ) {
        iVar3 = Of_CutSize(pCut);
        bVar6 = false;
        if (Flag < iVar3) {
          SlowCon = Of_CutVar(pCut,Flag);
          bVar6 = false;
          if (SlowCon != 0) {
            Delay = Of_CutFlag(pCut,Flag);
            bVar6 = true;
          }
        }
        if (!bVar6) {
          return;
        }
        if (Delay == 0) {
          iVar3 = Of_ObjDelay1(p,SlowCon);
          if (*pDelay1 < iVar3 + iVar1) {
            __assert_fail("Of_ObjDelay1(p, iVar) + DelayLut1 <= *pDelay1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                          ,0x55c,
                          "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)"
                         );
          }
        }
        else {
          iVar3 = Of_ObjDelay2(p,SlowCon);
          if (*pDelay1 < iVar3 + iVar2) {
            __assert_fail("Of_ObjDelay2(p, iVar) + DelayLut2 <= *pDelay1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                          ,0x55a,
                          "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)"
                         );
          }
        }
        iVar3 = Of_ObjDelay1(p,SlowCon);
        if (*(int *)Delays._16_8_ < iVar3 + iVar1) break;
        Flag = Flag + 1;
      }
      __assert_fail("Of_ObjDelay1(p, iVar) + DelayLut1 <= *pDelay2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                    ,0x55d,
                    "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)");
    }
    SlowCon = Of_CutVar(pCut,(&DelayLut2)[Flag]);
    iVar4 = local_48[Flag];
    iVar5 = Of_ObjDelay1(p,SlowCon);
    if (iVar4 != iVar5 + iVar1) {
      __assert_fail("Delays[k] == Of_ObjDelay1(p, iVar) + DelayLut1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                    ,0x53a,
                    "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)");
    }
    iVar4 = Of_ObjDelay2(p,SlowCon);
    fDirConWorks = iVar4 + iVar2;
    if ((((Flag < p->pPars->nFastEdges) && (local_9c < local_48[Flag])) &&
        (fDirConWorks < local_48[Flag])) && (bVar6)) {
      pObj = Gia_ManObj(p->pGia,SlowCon);
      iVar4 = Gia_ObjIsAndNotBuf(pObj);
      if (iVar4 == 0) goto LAB_009c5e38;
      Of_CutSetFlag(pCut,(&DelayLut2)[Flag],1);
    }
    else {
LAB_009c5e38:
      fDirConWorks = local_48[Flag];
      Of_CutSetFlag(pCut,(&DelayLut2)[Flag],0);
      bVar6 = false;
    }
    iVar4 = Abc_MaxInt(*pDelay1,fDirConWorks);
    *pDelay1 = iVar4;
    iVar4 = Abc_MaxInt(*(int *)Delays._16_8_,local_48[Flag]);
    *(int *)Delays._16_8_ = iVar4;
    Flag = Flag + 1;
  } while( true );
}

Assistant:

void Of_ManComputeForwardDirconCut( Of_Man_t * p, int iObj, int * pCut, int * pDelay1, int * pDelay2 )
{
    // Delay1 - main delay;  Delay2 - precomputed LUT delay in terms of Delay1 for the fanins
    int Delays[6], Perm[6] = {0, 1, 2, 3, 4, 5}; 
    int DelayLut1 = p->pPars->nDelayLut1;
    int DelayLut2 = p->pPars->nDelayLut2;
    int nSize = Of_CutSize(pCut);
    int k, iVar, Flag, SlowCon, Delay, DelayAfter, fDirConWorks;
    Of_CutForEachVar( pCut, iVar, k )
    {
        Delays[k] = Of_ObjDelay1(p, iVar) + DelayLut1;
//        printf( "%3d%s ", iVar, Flag ? "*" : " " );
    }
    for ( ; k < p->pPars->nLutSize; k++ )
    {
        Delays[k] = -ABC_INFINITY;
//        printf( "     " );
    }
    Vec_IntSelectSortCost2Reverse( Perm, nSize, Delays );
    assert( nSize < 2 || Delays[0] >= Delays[nSize-1] );
    assert( Delays[0] >= 0 && Delays[nSize-1] >= 0 );
    // consider speedup due to dircons
    fDirConWorks = 1;
    *pDelay1 = *pDelay2 = 0;
    SlowCon = p->pPars->nFastEdges < nSize ? Delays[p->pPars->nFastEdges] : 0;
    for ( k = 0; k < nSize; k++ )
    {
        // use dircon if the following is true
        // - the input is eligible for dircon (does not exceed the limit)
        // - there is an expected gain in delay, compared the largest delay without dircon
        // - the dircon delay is indeed lower than the largest delay without dircon
        // - all previous dircons worked out well
        // - the node is an AND-gate 
        iVar = Of_CutVar( pCut, Perm[k] );
        assert( Delays[k] == Of_ObjDelay1(p, iVar) + DelayLut1 );
        DelayAfter = Of_ObjDelay2(p, iVar) + DelayLut2;
        if ( k < p->pPars->nFastEdges && Delays[k] > SlowCon && DelayAfter < Delays[k] && fDirConWorks && Gia_ObjIsAndNotBuf(Gia_ManObj(p->pGia, iVar)) )
        {
            Delay = DelayAfter;
            Of_CutSetFlag( pCut, Perm[k], 1 );
        }
        else
        {
            Delay = Delays[k];// + DelayLut2;
            Of_CutSetFlag( pCut, Perm[k], 0 );
            fDirConWorks = 0;
        }
        *pDelay1 = Abc_MaxInt( *pDelay1, Delay );
        *pDelay2 = Abc_MaxInt( *pDelay2, Delays[k] );
    }
//    printf( "   %5.2f",   Of_Int2Flt(*pDelay1) );
//    printf( "   %5.2f\n", Of_Int2Flt(*pDelay2) );
    // do not use the structure if simple LUT is better
    if ( *pDelay1 > *pDelay2 )
    {
        for ( k = 0; k < nSize; k++ )
            Of_CutSetFlag( pCut, k, 0 );
        *pDelay1 = *pDelay2;
    }
    assert( *pDelay1 <= *pDelay2 );
    Of_CutSetDelay1( pCut, *pDelay1 );
    Of_CutSetDelay2( pCut, *pDelay2 );
    // verify
    Of_CutForEachVarFlag( pCut, iVar, Flag, k )
    {
        if ( Flag )
            assert( Of_ObjDelay2(p, iVar) + DelayLut2 <= *pDelay1 );
        else
            assert( Of_ObjDelay1(p, iVar) + DelayLut1 <= *pDelay1 );
        assert( Of_ObjDelay1(p, iVar) + DelayLut1 <= *pDelay2 );
    }
}